

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::evaluateHierarchicalFunctionsGPU
          (GridLocalPolynomial *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int iVar1;
  int iVar2;
  AccelerationContext *pAVar3;
  TypeOneDRule TVar4;
  int iVar5;
  pointer pCVar6;
  double *pdVar7;
  double *pdVar8;
  double *gpu_y_local;
  int cpu_num_x_local;
  double *gpu_x_local;
  GridLocalPolynomial *this_local;
  
  loadGpuBasis<double>(this);
  pAVar3 = (this->super_BaseCanonicalGrid).acceleration;
  iVar1 = this->order;
  TVar4 = RuleLocal::getRule(this->effective_rule);
  iVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  iVar5 = BaseCanonicalGrid::getNumPoints(&this->super_BaseCanonicalGrid);
  pCVar6 = std::
           unique_ptr<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           ::operator->(&this->gpu_cache);
  pdVar7 = GpuVector<double>::data(&pCVar6->nodes);
  pCVar6 = std::
           unique_ptr<TasGrid::CudaLocalPolynomialData<double>,_std::default_delete<TasGrid::CudaLocalPolynomialData<double>_>_>
           ::operator->(&this->gpu_cache);
  pdVar8 = GpuVector<double>::data(&pCVar6->support);
  TasGpu::devalpwpoly<double>(pAVar3,iVar1,TVar4,iVar2,cpu_num_x,iVar5,gpu_x,pdVar7,pdVar8,gpu_y);
  return;
}

Assistant:

void GridLocalPolynomial::evaluateHierarchicalFunctionsGPU(const double gpu_x[], int cpu_num_x, double *gpu_y) const{
    loadGpuBasis<double>();
    TasGpu::devalpwpoly(acceleration, order, RuleLocal::getRule(effective_rule), num_dimensions, cpu_num_x, getNumPoints(), gpu_x, gpu_cache->nodes.data(), gpu_cache->support.data(), gpu_y);
}